

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_feedback(REF_GRID ref_grid,char *filename)

{
  REF_INT RVar1;
  REF_GEOM pRVar2;
  REF_MPI pRVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  FILE *__s;
  ulong uVar9;
  undefined8 uVar10;
  REF_STATUS RVar11;
  char *pcVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  REF_INT edgeid;
  REF_DBL curve;
  REF_DBL diag;
  REF_DBL short_edge;
  REF_DBL angle;
  REF_DBL location [3];
  uint local_98;
  uint local_94;
  uint local_84;
  uint local_80;
  uint local_7c;
  char *local_78;
  REF_NODE local_70;
  double local_68;
  REF_DBL local_60;
  double local_58;
  double local_50;
  REF_DBL local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  pRVar2 = ref_grid->geom;
  pRVar3 = ref_grid->mpi;
  if (pRVar2->effective != 0) {
    if (pRVar3->id != 0) {
      return 0;
    }
    puts("ref_geom_feedback does not support Effective EGADS");
    return 0;
  }
  uVar9 = (ulong)ref_grid->partitioner;
  local_78 = filename;
  if (uVar9 == 1) {
    local_70 = ref_grid->node;
    if ((pRVar3->id == 0) &&
       (puts("Triaging geometry for issues impacting efficiency and robustness"), pRVar3->id == 0))
    {
      printf("scanning for discrete face corners with slivers or cusps of %.1f deg or less\n",
             0x4024000000000000);
      puts("slivers in flat regions constrain the mesh and are efficiency concerns");
      puts("cusps (very small angles) in curved regions may be fatal with loose tolerances");
      puts("  because the edge/face topology becomes ambiguous with adaptive refinement");
    }
    if (pRVar2->max < 1) {
      local_98 = 0;
    }
    else {
      lVar15 = 0;
      lVar16 = 0;
      local_98 = 0;
      do {
        if (*(int *)((long)pRVar2->descr + lVar15) == 0) {
          uVar14 = *(uint *)((long)pRVar2->descr + lVar15 + 0x14);
          uVar5 = ref_geom_node_min_angle
                            ((REF_GRID)ref_grid->node,(REF_INT)ref_grid->cell[0],
                             (REF_DBL *)(ulong)uVar14);
          if (uVar5 != 0) {
            pcVar12 = "node angle";
            uVar10 = 0xaee;
            goto LAB_0014a5c0;
          }
          if (local_50 <= 10.0) {
            lVar8 = (long)(int)uVar14;
            pRVar4 = local_70->real;
            printf("%f %f %f # sliver deg=%.3f at geom node %d\n",pRVar4[lVar8 * 0xf],
                   pRVar4[lVar8 * 0xf + 1],pRVar4[lVar8 * 0xf + 2],
                   (ulong)*(uint *)((long)pRVar2->descr + lVar15 + 4));
            local_98 = local_98 + 1;
          }
        }
        lVar16 = lVar16 + 1;
        lVar15 = lVar15 + 0x18;
      } while (lVar16 < pRVar2->max);
    }
    iVar6 = pRVar3->id;
    if (iVar6 == 0) {
      printf("%d geometry nodes with slivers or cusps of %.1f deg or less\n",0x4024000000000000,
             (ulong)local_98);
      iVar6 = pRVar3->id;
    }
    if (pRVar2->model == (void *)0x0) {
      local_94 = 0;
LAB_0014a20a:
      uVar14 = 0;
    }
    else {
      if (iVar6 == 0) {
        printf("scanning for geom nodes with shortest/longest edge ratios of %.3f or less\n",
               0x3f50624dd2f1a9fc);
        puts("short edges are efficiency concerns that rarely create failures.");
      }
      if (pRVar2->max < 1) {
        local_94 = 0;
      }
      else {
        lVar16 = 0;
        lVar15 = 0;
        local_94 = 0;
        do {
          if (*(int *)((long)pRVar2->descr + lVar16) == 0) {
            RVar1 = *(REF_INT *)((long)pRVar2->descr + lVar16 + 0x14);
            uVar5 = ref_geom_node_short_edge
                              ((REF_GRID)ref_grid->geom,RVar1,&local_58,&local_60,
                               (REF_INT *)&local_80);
            if (uVar5 != 0) {
              pcVar12 = "short edge";
              uVar10 = 0xb09;
              goto LAB_0014a5c0;
            }
            if (local_58 <= 0.001) {
              lVar8 = (long)RVar1;
              pRVar4 = local_70->real;
              printf("%f %f %f # short edge %.2e ratio %.2e id %d\n",pRVar4[lVar8 * 0xf],
                     pRVar4[lVar8 * 0xf + 1],pRVar4[lVar8 * 0xf + 2],local_60,(ulong)local_80);
              local_94 = local_94 + 1;
            }
          }
          lVar15 = lVar15 + 1;
          lVar16 = lVar16 + 0x18;
        } while (lVar15 < pRVar2->max);
      }
      iVar6 = pRVar3->id;
      if (iVar6 == 0) {
        printf("%d geometry nodes with shortest/longest edge ratios of %.3f or less\n",
               0x3f50624dd2f1a9fc,(ulong)local_94);
        iVar6 = pRVar3->id;
      }
      if (pRVar2->model == (void *)0x0) goto LAB_0014a20a;
      if (iVar6 == 0) {
        puts("scanning for surface curvature tighter than face-edge tolerance");
        puts("tight surface curvature is ignored where it reduces mesh");
        puts("  spacing below edge and face parameter curve tolerance");
        puts("these locations are likely to be accommodated unless");
        puts("  the error estimation resolves the high surface curvature");
      }
      uVar14 = 0;
      if (0 < pRVar2->nedge) {
        uVar5 = 0;
        uVar14 = 0;
        do {
          uVar5 = uVar5 + 1;
          uVar7 = ref_geom_face_curve_tol(ref_grid,uVar5,&local_68,&local_48);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xb24,"ref_geom_feedback",(ulong)uVar7,"curved face");
            return uVar7;
          }
          if (local_68 < 1.0) {
            printf("%f %f %f # curve/tol %.3e face id %d\n",local_48,local_40,local_38,(ulong)uVar5)
            ;
            uVar14 = uVar14 + 1;
          }
        } while ((int)uVar5 < pRVar2->nedge);
      }
      if (pRVar3->id != 0) {
        return 0;
      }
      printf("%d locations with filtered curvature\n",(ulong)uVar14);
      iVar6 = pRVar3->id;
    }
    pcVar12 = local_78;
    if ((iVar6 == 0) && (((0 < (int)local_98 || (0 < (int)local_94)) || (0 < (int)uVar14)))) {
      local_7c = uVar14;
      __s = fopen(local_78,"w");
      if (__s == (FILE *)0x0) {
        printf("unable to open %s\n",pcVar12);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xb34,"ref_geom_feedback","unable to open file");
        return 2;
      }
      fwrite("title=\"tecplot refine geometry triage\"\n",0x27,1,__s);
      fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,__s);
      if (0 < (int)local_98) {
        local_84 = 0;
        printf("exporting slivers locations to %s\n",local_78);
        fprintf(__s,"zone t=\"sliver\", i=%d, datapacking=%s\n",(ulong)local_98,"point");
        if (0 < pRVar2->max) {
          lVar16 = 0;
          lVar15 = 0;
          local_84 = 0;
          do {
            if (*(int *)((long)pRVar2->descr + lVar16) == 0) {
              uVar14 = *(uint *)((long)pRVar2->descr + lVar16 + 0x14);
              uVar5 = ref_geom_node_min_angle
                                ((REF_GRID)ref_grid->node,(REF_INT)ref_grid->cell[0],
                                 (REF_DBL *)(ulong)uVar14);
              if (uVar5 != 0) {
                pcVar12 = "node angle";
                uVar10 = 0xb3f;
                goto LAB_0014a5c0;
              }
              if (local_50 <= 10.0) {
                lVar8 = (long)(int)uVar14;
                pRVar4 = local_70->real;
                fprintf(__s,"# sliver deg=%.3f at geom node %d\n %f %f %f\n",local_50,
                        pRVar4[lVar8 * 0xf],pRVar4[lVar8 * 0xf + 1],pRVar4[lVar8 * 0xf + 2],
                        (ulong)*(uint *)((long)pRVar2->descr + lVar16 + 4));
                local_84 = local_84 + 1;
              }
            }
            lVar15 = lVar15 + 1;
            lVar16 = lVar16 + 0x18;
          } while (lVar15 < pRVar2->max);
        }
        if (local_98 != local_84) {
          uVar9 = (ulong)(int)local_84;
          uVar13 = (ulong)local_98;
          pcVar12 = "tecplot sliver different recount";
          uVar10 = 0xb48;
          goto LAB_00149fb0;
        }
      }
      if (0 < (int)local_94) {
        local_98 = 0;
        printf("exporting short edge locations to %s\n",local_78);
        fprintf(__s,"zone t=\"short edge\", i=%d, datapacking=%s\n",(ulong)local_94,"point");
        if (0 < pRVar2->max) {
          lVar16 = 0;
          lVar15 = 0;
          local_98 = 0;
          do {
            if (*(int *)((long)pRVar2->descr + lVar16) == 0) {
              RVar1 = *(REF_INT *)((long)pRVar2->descr + lVar16 + 0x14);
              uVar5 = ref_geom_node_short_edge
                                ((REF_GRID)ref_grid->geom,RVar1,&local_58,&local_60,
                                 (REF_INT *)&local_80);
              if (uVar5 != 0) {
                pcVar12 = "short edge";
                uVar10 = 0xb54;
                goto LAB_0014a5c0;
              }
              if (local_58 <= 0.001) {
                lVar8 = (long)RVar1;
                pRVar4 = local_70->real;
                fprintf(__s,"# short edge diagonal %.3e ratio %.3e edge id %d\n%f %f %f\n",local_60,
                        local_58,pRVar4[lVar8 * 0xf],pRVar4[lVar8 * 0xf + 1],pRVar4[lVar8 * 0xf + 2]
                        ,(ulong)local_80);
                local_98 = local_98 + 1;
              }
            }
            lVar15 = lVar15 + 1;
            lVar16 = lVar16 + 0x18;
          } while (lVar15 < pRVar2->max);
        }
        if (local_94 != local_98) {
          uVar9 = (ulong)(int)local_98;
          uVar13 = (ulong)local_94;
          pcVar12 = "tecplot short edge different recount";
          uVar10 = 0xb5e;
          goto LAB_00149fb0;
        }
      }
      uVar14 = local_7c;
      if (0 < (int)local_7c) {
        uVar7 = 0;
        printf("exporting filtered high curvature locations to %s\n",local_78);
        fprintf(__s,"zone t=\"filtered\", i=%d, datapacking=%s\n",(ulong)uVar14,"point");
        if (0 < pRVar2->nedge) {
          uVar14 = 0;
          uVar7 = 0;
          do {
            uVar14 = uVar14 + 1;
            uVar5 = ref_geom_face_curve_tol(ref_grid,uVar14,&local_68,&local_48);
            if (uVar5 != 0) {
              pcVar12 = "curved face";
              uVar10 = 0xb68;
LAB_0014a5c0:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,uVar10,"ref_geom_feedback",(ulong)uVar5,pcVar12);
              return uVar5;
            }
            if (local_68 < 1.0) {
              fprintf(__s,"# curve/tol %.3e face id %d\n%f %f %f\n",local_68,local_48,local_40,
                      local_38,(ulong)uVar14);
              uVar7 = uVar7 + 1;
            }
          } while ((int)uVar14 < pRVar2->nedge);
        }
        if (local_7c != uVar7) {
          uVar9 = (ulong)(int)uVar7;
          uVar13 = (ulong)local_7c;
          pcVar12 = "tecplot filtered curvature different recount";
          uVar10 = 0xb6f;
          goto LAB_00149fb0;
        }
      }
      fclose(__s);
    }
    RVar11 = 0;
  }
  else {
    pcVar12 = "parallel implementation is incomplete";
    uVar13 = 1;
    uVar10 = 0xad5;
LAB_00149fb0:
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar10,
           "ref_geom_feedback",pcVar12,uVar13,uVar9);
    RVar11 = 1;
  }
  return RVar11;
}

Assistant:

REF_FCN REF_STATUS ref_geom_feedback(REF_GRID ref_grid, const char *filename) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT geom, node, edgeid, faceid;
  REF_DBL angle_tol = 10.0;
  REF_DBL angle;
  REF_DBL short_edge_tol = 1e-3;
  REF_DBL short_edge, diag;
  REF_DBL curve;
  REF_DBL location[3];
  REF_INT nsliver, nshort, nfilter;

  if (ref_geom_effective(ref_geom)) {
    /* EFFECTIVE */
    if (ref_mpi_once(ref_grid_mpi(ref_grid)))
      printf("ref_geom_feedback does not support Effective EGADS\n");
    return REF_SUCCESS;
  }

  REIS(REF_MIGRATE_SINGLE, ref_grid_partitioner(ref_grid),
       "parallel implementation is incomplete");

  if (ref_mpi_once(ref_mpi))
    printf(
        "Triaging geometry for issues impacting efficiency and robustness\n");

  if (ref_mpi_once(ref_mpi)) {
    printf(
        "scanning for discrete face corners with slivers or cusps of %.1f deg "
        "or "
        "less\n",
        angle_tol);
    printf(
        "slivers in flat regions constrain the mesh and are efficiency "
        "concerns\n");
    printf(
        "cusps (very small angles) in curved regions may be fatal with loose "
        "tolerances\n");
    printf(
        "  because the edge/face topology becomes ambiguous with adaptive "
        "refinement\n");
  }
  nsliver = 0;
  each_ref_geom_node(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    RSS(ref_geom_node_min_angle(ref_grid, node, &angle), "node angle");
    if (angle <= angle_tol) {
      printf("%f %f %f # sliver deg=%.3f at geom node %d\n",
             ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
             ref_node_xyz(ref_node, 2, node), angle,
             ref_geom_id(ref_geom, geom));
      nsliver++;
    }
  }
  if (ref_mpi_once(ref_mpi))
    printf("%d geometry nodes with slivers or cusps of %.1f deg or less\n",
           nsliver, angle_tol);

  nshort = 0;
  if (ref_geom_model_loaded(ref_geom)) {
    if (ref_mpi_once(ref_mpi)) {
      printf(
          "scanning for geom nodes with shortest/longest edge ratios of %.3f "
          "or "
          "less\n",
          short_edge_tol);
      printf(
          "short edges are efficiency concerns that rarely create failures.\n");
    }
    each_ref_geom_node(ref_geom, geom) {
      node = ref_geom_node(ref_geom, geom);
      RSS(ref_geom_node_short_edge(ref_grid, node, &short_edge, &diag, &edgeid),
          "short edge");
      if (short_edge <= short_edge_tol) {
        printf("%f %f %f # short edge %.2e ratio %.2e id %d\n",
               ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
               ref_node_xyz(ref_node, 2, node), diag, short_edge, edgeid);
        nshort++;
      }
    }
    if (ref_mpi_once(ref_mpi))
      printf(
          "%d geometry nodes with shortest/longest edge ratios of %.3f or "
          "less\n",
          nshort, short_edge_tol);
  }

  nfilter = 0;
  if (ref_geom_model_loaded(ref_geom)) {
    if (ref_mpi_once(ref_mpi)) {
      printf(
          "scanning for surface curvature tighter than face-edge tolerance\n");
      printf("tight surface curvature is ignored where it reduces mesh\n");
      printf("  spacing below edge and face parameter curve tolerance\n");
      printf("these locations are likely to be accommodated unless\n");
      printf("  the error estimation resolves the high surface curvature\n");
    }
    for (faceid = 1; faceid <= ref_geom->nedge; faceid++) {
      RSS(ref_geom_face_curve_tol(ref_grid, faceid, &curve, location),
          "curved face");
      if (curve < 1.0) {
        printf("%f %f %f # curve/tol %.3e face id %d\n", location[0],
               location[1], location[2], curve, faceid);
        nfilter++;
      }
    }
    if (ref_mpi_once(ref_mpi))
      printf("%d locations with filtered curvature\n", nfilter);
  }

  if (ref_mpi_once(ref_mpi) && (nsliver > 0 || nshort > 0 || nfilter > 0)) {
    FILE *file;
    REF_INT n;
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    fprintf(file, "title=\"tecplot refine geometry triage\"\n");
    fprintf(file, "variables = \"x\" \"y\" \"z\"\n");

    if (nsliver > 0) {
      printf("exporting slivers locations to %s\n", filename);
      fprintf(file, "zone t=\"sliver\", i=%d, datapacking=%s\n", nsliver,
              "point");
      n = 0;
      each_ref_geom_node(ref_geom, geom) {
        node = ref_geom_node(ref_geom, geom);
        RSS(ref_geom_node_min_angle(ref_grid, node, &angle), "node angle");
        if (angle <= angle_tol) {
          fprintf(file, "# sliver deg=%.3f at geom node %d\n %f %f %f\n", angle,
                  ref_geom_id(ref_geom, geom), ref_node_xyz(ref_node, 0, node),
                  ref_node_xyz(ref_node, 1, node),
                  ref_node_xyz(ref_node, 2, node));
          n++;
        }
      }
      REIS(nsliver, n, "tecplot sliver different recount");
    }

    if (nshort > 0) {
      printf("exporting short edge locations to %s\n", filename);
      fprintf(file, "zone t=\"short edge\", i=%d, datapacking=%s\n", nshort,
              "point");
      n = 0;
      each_ref_geom_node(ref_geom, geom) {
        node = ref_geom_node(ref_geom, geom);
        RSS(ref_geom_node_short_edge(ref_grid, node, &short_edge, &diag,
                                     &edgeid),
            "short edge");
        if (short_edge <= short_edge_tol) {
          fprintf(
              file,
              "# short edge diagonal %.3e ratio %.3e edge id %d\n%f %f %f\n",
              diag, short_edge, edgeid, ref_node_xyz(ref_node, 0, node),
              ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node));
          n++;
        }
      }
      REIS(nshort, n, "tecplot short edge different recount");
    }

    if (nfilter > 0) {
      printf("exporting filtered high curvature locations to %s\n", filename);
      fprintf(file, "zone t=\"filtered\", i=%d, datapacking=%s\n", nfilter,
              "point");
      n = 0;
      for (faceid = 1; faceid <= ref_geom->nedge; faceid++) {
        RSS(ref_geom_face_curve_tol(ref_grid, faceid, &curve, location),
            "curved face");
        if (curve < 1.0) {
          fprintf(file, "# curve/tol %.3e face id %d\n%f %f %f\n", curve,
                  faceid, location[0], location[1], location[2]);
          n++;
        }
      }
      REIS(nfilter, n, "tecplot filtered curvature different recount");
    }

    fclose(file);
  }
  return REF_SUCCESS;
}